

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall
ON_MeshParameters::ON_MeshParameters
          (ON_MeshParameters *this,double normalized_mesh_density,double min_edge_length)

{
  bool bVar1;
  undefined1 local_60 [8];
  ON_SubDDisplayParameters subd_parameters;
  double min_edge_length_local;
  double normalized_mesh_density_local;
  ON_MeshParameters *this_local;
  
  this->m_bCustomSettings = false;
  this->m_bCustomSettingsEnabled = true;
  this->m_bComputeCurvature = false;
  this->m_bSimplePlanes = false;
  this->m_bRefine = true;
  this->m_bJaggedSeams = false;
  this->m_bDoublePrecision = false;
  this->m_bClosedObjectPostProcess = false;
  (this->m_mesher_id).Data1 = 0;
  (this->m_mesher_id).Data2 = 0;
  (this->m_mesher_id).Data3 = 0;
  (this->m_mesher_id).Data4[0] = '\0';
  (this->m_mesher_id).Data4[1] = '\0';
  (this->m_mesher_id).Data4[2] = '\0';
  (this->m_mesher_id).Data4[3] = '\0';
  (this->m_mesher_id).Data4[4] = '\0';
  (this->m_mesher_id).Data4[5] = '\0';
  (this->m_mesher_id).Data4[6] = '\0';
  (this->m_mesher_id).Data4[7] = '\0';
  this->m_mesher = '\0';
  this->m_texture_range = '\x02';
  this->m_face_type = '\0';
  this->m_subd_mesh_parameters_as_char = '\0';
  this->m_grid_min_count = 0;
  this->m_grid_max_count = 0;
  *(undefined8 *)(this->m_geometry_settings_hash).m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_
  ;
  *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) =
       ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  this->m_reserved2 = 0;
  this->m_tolerance = 0.0;
  this->m_relative_tolerance = 0.0;
  this->m_min_tolerance = 0.0;
  this->m_min_edge_length = 0.0001;
  this->m_max_edge_length = 0.0;
  this->m_grid_aspect_ratio = 6.0;
  this->m_grid_angle_radians = 0.3490658503988659;
  this->m_grid_amplification = 1.0;
  this->m_refine_angle_radians = 0.3490658503988659;
  this->m_reserved3 = false;
  this->m_reserved4 = false;
  this->m_bEvaluatorBasedTessellation = false;
  this->m_curve_tess_min_num_segments = 0;
  this->m_curve_tess_angle_tol_in_degrees = 20.0;
  this->m_curve_tess_max_dist_between_points = 0.0;
  this->m_curve_tess_min_parametric_ratio = 1e-05;
  this->m_surface_tess_angle_tol_in_degrees = 20.0;
  this->m_surface_tess_max_edge_length = 0.0;
  this->m_surface_tess_min_edge_length = 0.0;
  this->m_surface_tess_min_edge_length_ratio_uv = 0.0001;
  this->m_surface_tess_max_aspect_ratio = 0.0;
  this->m_smoothing_passes = 0;
  this->m_subd_stuff_reserved5 = 0;
  this->m_reserved6 = 0;
  subd_parameters.m_progress_reporter_interval.m_t[1] = min_edge_length;
  SetTextureRange(this,0);
  SetGridAngleRadians(this,0.0);
  SetGridAmplification(this,0.0);
  SetRefineAngleRadians(this,0.0);
  SetMinimumEdgeLength(this,subd_parameters.m_progress_reporter_interval.m_t[1]);
  bVar1 = ON_IsValid(normalized_mesh_density);
  if (bVar1) {
    if (0.0 <= normalized_mesh_density) {
      min_edge_length_local = normalized_mesh_density;
      if (1.0 < normalized_mesh_density) {
        min_edge_length_local = 1.0;
      }
    }
    else {
      min_edge_length_local = 0.0;
    }
    SetRelativeTolerance(this,min_edge_length_local);
    SetRefine(this,min_edge_length_local < 0.65);
    SetSimplePlanes(this,min_edge_length_local == 0.0);
    ON_SubDDisplayParameters::CreateFromMeshDensity
              ((ON_SubDDisplayParameters *)local_60,min_edge_length_local);
    SetSubDDisplayParameters(this,(ON_SubDDisplayParameters *)local_60);
  }
  return;
}

Assistant:

ON_MeshParameters::ON_MeshParameters(
  double normalized_mesh_density,
  double min_edge_length
  )
{
  // non-default values
  SetTextureRange(0);
  SetGridAngleRadians(0.0);
  SetGridAmplification(0.0);
  SetRefineAngleRadians(0.0);
  SetMinimumEdgeLength(min_edge_length);

  if ( ON_IsValid(normalized_mesh_density) )
  {
    if (normalized_mesh_density < 0.0 )
      normalized_mesh_density = 0.0;
    else if (normalized_mesh_density > 1.0 )
      normalized_mesh_density = 1.0;
    SetRelativeTolerance(normalized_mesh_density);
    SetRefine((normalized_mesh_density < 0.65));
    SetSimplePlanes((0.0 == normalized_mesh_density));

    ON_SubDDisplayParameters subd_parameters = ON_SubDDisplayParameters::CreateFromMeshDensity(normalized_mesh_density);
    SetSubDDisplayParameters(subd_parameters);
  }
}